

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field_test.cc
# Opt level: O2

void __thiscall
google::protobuf::internal::MapFieldBasePrimitiveTest_MutableRepeatedField_Test::
~MapFieldBasePrimitiveTest_MutableRepeatedField_Test
          (MapFieldBasePrimitiveTest_MutableRepeatedField_Test *this)

{
  MapFieldBasePrimitiveTest::~MapFieldBasePrimitiveTest(&this->super_MapFieldBasePrimitiveTest);
  operator_delete(this,0x78);
  return;
}

Assistant:

TEST_P(MapFieldBasePrimitiveTest, MutableRepeatedField) {
  RepeatedPtrField<Message>* repeated =
      reinterpret_cast<RepeatedPtrField<Message>*>(
          map_field_base_->MutableRepeatedField());
  EXPECT_EQ(2, repeated->size());
  for (int i = 0; i < repeated->size(); i++) {
    const Message& message = repeated->Get(i);
    int key = message.GetReflection()->GetInt32(message, key_descriptor_);
    int value = message.GetReflection()->GetInt32(message, value_descriptor_);
    EXPECT_EQ(value, initial_value_map_[key]);
  }
}